

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O3

void __thiscall
QGraphicsScenePrivate::sendMouseEvent
          (QGraphicsScenePrivate *this,QGraphicsSceneMouseEvent *mouseEvent)

{
  QGraphicsItem *this_00;
  QGraphicsItemPrivate *this_01;
  MouseButton MVar1;
  bool bVar2;
  MouseButton MVar3;
  QFlagsStorage<Qt::MouseButton> QVar4;
  QWidget *viewport;
  QPoint QVar5;
  long lVar6;
  qreal *pqVar7;
  QPointF *pQVar8;
  int i;
  long in_FS_OFFSET;
  byte bVar9;
  qreal qVar10;
  MouseButton button;
  QTransform mapFromScene;
  QPointF local_c0;
  MouseButton local_ac;
  QPointF local_a8;
  QPointF local_98;
  QPointF local_88 [5];
  long local_38;
  
  bVar9 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  MVar3 = QGraphicsSceneMouseEvent::button(mouseEvent);
  if (MVar3 == NoButton) {
    QVar4.i = (Int)QGraphicsSceneMouseEvent::buttons(mouseEvent);
    if (((QFlagsStorage<Qt::MouseButton>)QVar4.i == (QFlagsStorage<Qt::MouseButton>)0x0) &&
       ((this->field_0xb9 & 8) != 0)) {
      if ((this->mouseGrabberItems).d.size != 0) {
        QGraphicsItem::ungrabMouse(*(this->mouseGrabberItems).d.ptr);
      }
      this->lastMouseGrabberItem = (QGraphicsItem *)0x0;
      goto LAB_0060254e;
    }
  }
  this_00 = (this->mouseGrabberItems).d.ptr[(this->mouseGrabberItems).d.size + -1];
  bVar2 = QGraphicsItem::isBlockedByModalPanel(this_00,(QGraphicsItem **)0x0);
  if (!bVar2) {
    pqVar7 = (qreal *)&DAT_006f3c60;
    pQVar8 = local_88;
    for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
      pQVar8->xp = *pqVar7;
      pqVar7 = pqVar7 + (ulong)bVar9 * -2 + 1;
      pQVar8 = (QPointF *)&pQVar8[-(ulong)bVar9].yp;
    }
    this_01 = (this_00->d_ptr).d;
    viewport = QGraphicsSceneEvent::widget(&mouseEvent->super_QGraphicsSceneEvent);
    QGraphicsItemPrivate::genericMapFromSceneTransform((QTransform *)local_88,this_01,viewport);
    local_a8 = QGraphicsSceneMouseEvent::scenePos(mouseEvent);
    qVar10 = local_a8.yp;
    local_98.xp = (qreal)QTransform::map(local_88);
    MVar3 = LeftButton;
    local_98.yp = qVar10;
    do {
      local_ac = MVar3;
      local_a8 = QMap<Qt::MouseButton,_QPointF>::value
                           (&this->mouseGrabberButtonDownPos,&local_ac,&local_98);
      QGraphicsSceneMouseEvent::setButtonDownPos(mouseEvent,MVar3,&local_a8);
      MVar1 = local_ac;
      local_c0 = QGraphicsSceneMouseEvent::scenePos(mouseEvent);
      local_a8 = QMap<Qt::MouseButton,_QPointF>::value
                           (&this->mouseGrabberButtonDownScenePos,&local_ac,&local_c0);
      QGraphicsSceneMouseEvent::setButtonDownScenePos(mouseEvent,MVar1,&local_a8);
      MVar1 = local_ac;
      QVar5 = QGraphicsSceneMouseEvent::screenPos(mouseEvent);
      local_c0.xp = (qreal)QVar5;
      QVar5 = QMap<Qt::MouseButton,_QPoint>::value
                        (&this->mouseGrabberButtonDownScreenPos,&local_ac,(QPoint *)&local_c0);
      local_a8.xp = (qreal)QVar5;
      QGraphicsSceneMouseEvent::setButtonDownScreenPos(mouseEvent,MVar1,(QPoint *)&local_a8);
      MVar3 = MVar3 * 2;
    } while ((int)MVar3 < 0x11);
    QGraphicsSceneMouseEvent::setPos(mouseEvent,&local_98);
    local_c0 = QGraphicsSceneMouseEvent::lastScenePos(mouseEvent);
    qVar10 = local_c0.yp;
    local_a8.xp = (qreal)QTransform::map(local_88);
    local_a8.yp = qVar10;
    QGraphicsSceneMouseEvent::setLastPos(mouseEvent,&local_a8);
    sendEvent(this,this_00,(QEvent *)mouseEvent);
  }
LAB_0060254e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::sendMouseEvent(QGraphicsSceneMouseEvent *mouseEvent)
{
    if (mouseEvent->button() == 0 && mouseEvent->buttons() == 0 && lastMouseGrabberItemHasImplicitMouseGrab) {
        // ### This is a temporary fix for until we get proper mouse
        // grab events.
        clearMouseGrabber();
        return;
    }

    QGraphicsItem *item = mouseGrabberItems.constLast();
    if (item->isBlockedByModalPanel())
        return;

    const QTransform mapFromScene = item->d_ptr->genericMapFromSceneTransform(mouseEvent->widget());
    const QPointF itemPos = mapFromScene.map(mouseEvent->scenePos());
    for (int i = 0x1; i <= 0x10; i <<= 1) {
        Qt::MouseButton button = Qt::MouseButton(i);
        mouseEvent->setButtonDownPos(button, mouseGrabberButtonDownPos.value(button, itemPos));
        mouseEvent->setButtonDownScenePos(button, mouseGrabberButtonDownScenePos.value(button, mouseEvent->scenePos()));
        mouseEvent->setButtonDownScreenPos(button, mouseGrabberButtonDownScreenPos.value(button, mouseEvent->screenPos()));
    }
    mouseEvent->setPos(itemPos);
    mouseEvent->setLastPos(mapFromScene.map(mouseEvent->lastScenePos()));
    sendEvent(item, mouseEvent);
}